

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O2

uint32 __thiscall Process::start(Process *this,String *commandLine,Map<String,_String> *environment)

{
  long lVar1;
  undefined1 auVar2 [8];
  ItemBlock *environment_00;
  uint32 uVar3;
  int *piVar4;
  char *pcVar5;
  ulong uVar6;
  Iterator IVar7;
  char **argv;
  char *apcStack_d0 [2];
  String local_c0;
  undefined1 local_98 [8];
  List<String> command;
  
  if (this->pid == 0) {
    local_98 = (undefined1  [8])&command._size;
    command._begin.item = (Item *)0x0;
    command._size = (usize)&String::emptyData;
    command.endItem.value._data.ref = 0;
    command.endItem.prev = (Item *)0x0;
    command.endItem.next = (Item *)0x0;
    command.freeItem = (Item *)0x0;
    apcStack_d0[0] = (char *)0x108c8a;
    command._end.item = (Item *)local_98;
    Private::splitCommandLine(commandLine,(List<String> *)local_98);
    if (command.endItem.value._data.ref == 0) {
      local_c0.data = &String::emptyData.super_Data;
      apcStack_d0[0] = (char *)0x108ca7;
      List<String>::append((List<String> *)local_98,&local_c0);
      apcStack_d0[0] = (char *)0x108cb3;
      String::~String(&local_c0);
    }
    auVar2 = local_98;
    lVar1 = -((long)command._begin.item * 8 + 0x17U & 0xfffffffffffffff0);
    argv = (char **)((long)apcStack_d0 + lVar1 + 8);
    uVar6 = 0;
    command.blocks = (ItemBlock *)environment;
    for (IVar7.item = command._end.item; (undefined1  [8])IVar7.item != auVar2;
        IVar7.item = (IVar7.item)->next) {
      *(undefined8 *)((long)apcStack_d0 + lVar1) = 0x108cee;
      pcVar5 = String::operator_cast_to_char_(&(IVar7.item)->value);
      argv[uVar6] = pcVar5;
      uVar6 = uVar6 + 1;
    }
    argv[uVar6 & 0xffffffff] = (char *)0x0;
    environment_00 = command.blocks;
    IVar7 = command._end;
    *(undefined8 *)((long)apcStack_d0 + lVar1) = 0x108d1f;
    uVar3 = start(this,&(IVar7.item)->value,(int)uVar6 + 1,argv,
                  (Map<String,_String> *)environment_00);
    *(undefined8 *)((long)apcStack_d0 + lVar1) = 0x108d2d;
    List<String>::~List((List<String> *)local_98);
  }
  else {
    apcStack_d0[0] = (char *)0x108c3f;
    piVar4 = __errno_location();
    *piVar4 = 0x16;
    uVar3 = 0;
  }
  return uVar3;
}

Assistant:

uint32 Process::start(const String& commandLine, const Map<String, String>& environment)
{
#ifdef _WIN32
  if(hProcess != INVALID_HANDLE_VALUE)
  {
    SetLastError(ERROR_INVALID_HANDLE);
    return 0;
  }

  STARTUPINFO si;
  PROCESS_INFORMATION pi;

  ZeroMemory(&si, sizeof(si));
  si.cb = sizeof(si);
  ZeroMemory(&pi, sizeof(pi));

  LPTSTR env = NULL;
  Buffer envBuffer;
  if (!environment.isEmpty())
  {
    usize bufferSize = 1;
    for (Map<String, String>::Iterator i = environment.begin(); i != environment.end(); ++i)
    {
      const String& key = i.key();
      const String& val = *i;
      if (key.isEmpty() || val.isEmpty())
          continue;
      bufferSize += key.length() + val.length() + 2;
    }
    envBuffer.reserve(bufferSize * sizeof(char));
    LPTSTR lptEnv = (LPTSTR)(byte*)envBuffer;
    env = lptEnv;
    for (Map<String, String>::Iterator i = environment.begin(); i != environment.end(); ++i)
    {
      const String& key = i.key();
      const String& val = *i;
      if (key.isEmpty() || val.isEmpty())
        continue;
      memcpy(lptEnv, (const char*)key, key.length() * sizeof(char));
      lptEnv += key.length();
      *(lptEnv++) = '=';
      memcpy(lptEnv, (const char*)val, val.length() * sizeof(char));
      lptEnv += val.length();
      *(lptEnv++) = '\0';
    }
    *lptEnv = '\0';
  }

  String args(commandLine);
  if(!CreateProcess(NULL, (char*)args, NULL, NULL, FALSE, 
#ifdef UNICODE
      CREATE_UNICODE_ENVIRONMENT
#else
      0
#endif
      , env, NULL, &si, &pi))
    return 0;

  CloseHandle(pi.hThread);

  ASSERT(pi.hProcess);
  hProcess = pi.hProcess;
  pid = pi.dwProcessId;

  return pi.dwProcessId;

#else
  if(pid)
  {
    errno = EINVAL;
    return false;
  }

  List<String> command;
  Private::splitCommandLine(commandLine, command);
  if(command.isEmpty())
    command.append(String());

  char** argv = (char**)alloca(sizeof(char*) * (command.size() + 1));
  int i = 0;
  for (List<String>::Iterator j = command.begin(), end = command.end(); j != end; ++j)
    argv[i++] = (char*)(const char*)*j;
  argv[i] = 0;
  return start(command.front(), i + 1, argv, environment);
#endif
}